

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::weakly_canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  path result;
  path pe;
  error_code tec;
  iterator __begin2;
  iterator __end2;
  path local_148;
  const_iterator local_128 [2];
  long local_118 [2];
  error_category *local_108;
  const_iterator local_100 [2];
  long local_f0 [2];
  path local_e0;
  error_code local_c0;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  iterator local_70;
  
  local_148._path._M_dataplus._M_p = (pointer)&local_148._path.field_2;
  local_148._path._M_string_length = 0;
  local_148._path.field_2._M_local_buf[0] = '\0';
  local_108 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = local_108;
  local_128[0]._M_current = (p->_path)._M_dataplus._M_p;
  local_100[0]._M_current = local_128[0]._M_current + (p->_path)._M_string_length;
  local_70._first._M_current = local_128[0]._M_current;
  path::iterator::iterator((iterator *)local_b0,&local_70._first,local_100,local_128);
  local_100[0]._M_current = (p->_path)._M_dataplus._M_p;
  local_128[0]._M_current = local_100[0]._M_current + (p->_path)._M_string_length;
  local_e0._path._M_dataplus._M_p = local_128[0]._M_current;
  path::iterator::iterator(&local_70,local_100,local_128,(const_iterator *)&local_e0);
  paVar3 = &(__return_storage_ptr__->_path).field_2;
  bVar1 = true;
  while ((char *)local_b0._24_8_ != local_70._iter._M_current) {
    local_100[0]._M_current = (char *)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_90._M_p,local_90._M_p + local_88);
    if (bVar1) {
      local_c0._M_value = 0;
      local_c0._M_cat = local_108;
      operator/((path *)local_128,&local_148,(path *)local_100);
      bVar2 = exists((path *)local_128,&local_c0);
      if ((long *)local_128[0]._M_current != local_118) {
        operator_delete(local_128[0]._M_current,local_118[0] + 1);
      }
      if (bVar2) {
        path::operator/=(&local_148,(path *)local_100);
LAB_001594ef:
        cVar4 = '\0';
      }
      else if (ec->_M_value == 0) {
        if (local_148._path._M_string_length == 0) {
          path::operator/=(&local_148,(path *)local_100);
          bVar1 = false;
          goto LAB_001594ef;
        }
        canonical(&local_e0,&local_148,ec);
        operator/((path *)local_128,&local_e0,(path *)local_100);
        std::__cxx11::string::operator=((string *)&local_148,(string *)local_128);
        if ((long *)local_128[0]._M_current != local_118) {
          operator_delete(local_128[0]._M_current,local_118[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._path._M_dataplus._M_p != &local_e0._path.field_2) {
          operator_delete(local_e0._path._M_dataplus._M_p,
                          local_e0._path.field_2._M_allocated_capacity + 1);
        }
        cVar4 = (ec->_M_value != 0) * '\x02';
        bVar1 = false;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar3;
        (__return_storage_ptr__->_path)._M_string_length = 0;
        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
        cVar4 = '\x01';
      }
    }
    else {
      cVar4 = '\0';
      path::operator/=(&local_148,(path *)local_100);
    }
    if ((long *)local_100[0]._M_current != local_f0) {
      operator_delete(local_100[0]._M_current,local_f0[0] + 1);
    }
    if (cVar4 != '\0') goto LAB_0015960c;
    path::iterator::operator++((iterator *)local_b0);
  }
  cVar4 = '\x02';
LAB_0015960c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
    operator_delete(local_70._current._path._M_dataplus._M_p,
                    local_70._current._path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if (cVar4 == '\x02') {
    if ((bVar1) && (local_148._path._M_string_length != 0)) {
      canonical((path *)local_b0,&local_148,ec);
      std::__cxx11::string::operator=((string *)&local_148,(string *)local_b0);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
    }
    if (ec->_M_value == 0) {
      path::lexically_normal(__return_storage_ptr__,&local_148);
    }
    else {
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar3;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._path._M_dataplus._M_p != &local_148._path.field_2) {
    operator_delete(local_148._path._M_dataplus._M_p,
                    CONCAT71(local_148._path.field_2._M_allocated_capacity._1_7_,
                             local_148._path.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path weakly_canonical(const path& p, std::error_code& ec) noexcept
{
    path result;
    ec.clear();
    bool scan = true;
    for (auto pe : p) {
        if (scan) {
            std::error_code tec;
            if (exists(result / pe, tec)) {
                result /= pe;
            }
            else {
                if (ec) {
                    return path();
                }
                scan = false;
                if (!result.empty()) {
                    result = canonical(result, ec) / pe;
                    if (ec) {
                        break;
                    }
                }
                else {
                    result /= pe;
                }
            }
        }
        else {
            result /= pe;
        }
    }
    if (scan) {
        if (!result.empty()) {
            result = canonical(result, ec);
        }
    }
    return ec ? path() : result.lexically_normal();
}